

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int parseArgs(int argc,char **argv,char **in_file_path_ptr,char **out_file_path_ptr,
             uint *target_driver_ptr,size_t *file_offset_ptr)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  
  bVar1 = 1 < argc;
  if (1 < argc) {
    pcVar10 = argv[1];
    uVar9 = 1;
    if (*pcVar10 == '-') {
      uVar2 = 3;
      do {
        uVar9 = uVar2;
        pcVar7 = argv[uVar9 - 1];
        iVar3 = strcmp(pcVar10,"-v");
        if (iVar3 == 0) {
          lVar5 = strtol(pcVar7,(char **)0x0,10);
          *target_driver_ptr = (uint)lVar5;
        }
        else {
          iVar3 = strcmp(pcVar10,"-o");
          if (iVar3 != 0) {
            fprintf(_stderr,"ERROR: Unrecognized option \"%s\"\n",pcVar10);
            return -1;
          }
          sVar4 = strtol(pcVar7,(char **)0x0,0x10);
          *file_offset_ptr = sVar4;
        }
        bVar1 = (int)uVar9 < argc;
        if (argc <= (int)uVar9) goto LAB_00106014;
        pcVar10 = argv[uVar9];
        uVar2 = uVar9 + 2;
      } while (*pcVar10 == '-');
    }
    if (bVar1) {
      uVar8 = (int)uVar9 + 1;
      pcVar10 = argv[uVar9 & 0xffffffff];
      *in_file_path_ptr = pcVar10;
      if ((int)uVar8 < argc) {
        pcVar7 = argv[uVar8];
      }
      else {
        sVar6 = strlen(pcVar10);
        pcVar7 = (char *)malloc(sVar6 + 5);
        snprintf(pcVar7,sVar6 + 5,"%s%s",pcVar10,".bin");
      }
      *out_file_path_ptr = pcVar7;
      return 0;
    }
  }
LAB_00106014:
  parseArgs_cold_1();
  return -2;
}

Assistant:

int parseArgs(
	int argc, 
	char *argv[], 
	const char ** in_file_path_ptr, 		// memory address for "in_file_path" argument
	const char ** out_file_path_ptr, 		// memory address for "out_file_path" argument
	unsigned int * target_driver_ptr,		// memory address for "target_driver_ptr" argument
	size_t * file_offset_ptr				// memory address for "file_offset_ptr"argument
) {

	int arg_index = 1;		// Tracks index of currently processed argument

	/* Process options (if available) */
	for (; arg_index < argc && argv[arg_index][0] == '-'; arg_index += 2) {
		const char * option_name = argv[arg_index];
		const char * option_raw_value = argv[arg_index+1];

		if (strcmp(option_name, "-v") == 0) {
			*target_driver_ptr = (unsigned int)strtol(option_raw_value, NULL, 10);
		}
		else if (strcmp(option_name, "-o") == 0) {
			*file_offset_ptr = (size_t)strtol(option_raw_value, NULL, 0x10);
		}
		else {
			fprintf(stderr, "ERROR: Unrecognized option \"%s\"\n", option_name);
			return -1;
		}
	}

	/* Process "in_file_path" argument */
	if (arg_index >= argc) {
		fprintf(stderr, "ERROR: Expected \"in_file_path\" after options\n");
		return -2;
	}

	*in_file_path_ptr = argv[arg_index++];

	/* Process "out_file_path" argument */
	if (arg_index >= argc) {
		const char * extension = ".bin";
		const size_t buffer_length = strlen(*in_file_path_ptr) + strlen(extension) + 1;
		char * buffer = malloc(buffer_length);

		snprintf(buffer, buffer_length, "%s%s", *in_file_path_ptr, extension);

		*out_file_path_ptr = (const char*)buffer;
	}
	else {
		*out_file_path_ptr = argv[arg_index++];
	}

	return 0;
}